

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonschema_draft6_tests.cpp
# Opt level: O0

json anon_unknown.dwarf_25d1775::resolver(uri *uri)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  undefined8 extraout_RDX;
  undefined8 in_RDI;
  json jVar4;
  fstream is;
  string pathname;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  basic_json_options<char> *this;
  undefined7 in_stack_fffffffffffffc10;
  uri *in_stack_fffffffffffffc18;
  allocator<char> *__a;
  _func_int **in_stack_fffffffffffffc38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  long local_278 [66];
  string local_68 [40];
  basic_json_decode_options<char> *in_stack_ffffffffffffffc0;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc8;
  string local_30 [48];
  
  __a = (allocator<char> *)&stack0xffffffffffffffcf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38,__a);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  jsoncons::uri::path_abi_cxx11_(in_stack_fffffffffffffc18);
  std::__cxx11::string::operator+=(local_30,local_68);
  std::__cxx11::string::~string(local_68);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_in,_S_out);
  std::fstream::fstream(local_278,pcVar3,_Var2);
  bVar1 = std::ios::operator!((ios *)((long)local_278 + *(long *)(local_278[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    this = (basic_json_options<char> *)&stack0xfffffffffffffc38;
    memset(this,0,0x148);
    jsoncons::basic_json_options<char>::basic_json_options
              ((basic_json_options<char> *)CONCAT17(bVar1,in_stack_fffffffffffffc10));
    jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::parse
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    jsoncons::basic_json_options<char>::~basic_json_options(this);
  }
  else {
    jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  }
  std::fstream::~fstream(local_278);
  std::__cxx11::string::~string(local_30);
  jVar4.field_0.int64_.val_ = extraout_RDX;
  jVar4.field_0._0_8_ = in_RDI;
  return (json)jVar4.field_0;
}

Assistant:

json resolver(const jsoncons::uri& uri)
    {
        //std::cout << uri.string() << ", " << uri.path() << "\n";
        std::string pathname = "./jsonschema/JSON-Schema-Test-Suite/remotes";
        pathname += std::string(uri.path());

        std::fstream is(pathname.c_str());
        if (!is)
        {
            return json::null();
        }

        return json::parse(is);
    }